

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_font_query_font_glyph
               (nk_handle handle,float height,nk_user_font_glyph *glyph,nk_rune codepoint,
               nk_rune next_codepoint)

{
  nk_font_glyph *pnVar1;
  nk_vec2 *in_RSI;
  nk_font *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  nk_vec2 nVar3;
  nk_font *font;
  nk_font_glyph *g;
  float scale;
  undefined8 in_stack_ffffffffffffffc0;
  
  if ((in_RDI != (nk_font *)0x0) && (in_RSI != (nk_vec2 *)0x0)) {
    fVar2 = in_XMM0_Da / (in_RDI->info).height;
    pnVar1 = nk_font_find_glyph(in_RDI,(nk_rune)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    in_RSI[3].x = (pnVar1->x1 - pnVar1->x0) * fVar2;
    in_RSI[3].y = (pnVar1->y1 - pnVar1->y0) * fVar2;
    nVar3 = nk_vec2(pnVar1->x0 * fVar2,pnVar1->y0 * fVar2);
    in_RSI[2] = nVar3;
    in_RSI[4].x = pnVar1->xadvance * fVar2;
    nVar3 = nk_vec2(pnVar1->u0,pnVar1->v0);
    *in_RSI = nVar3;
    nVar3 = nk_vec2(pnVar1->u1,pnVar1->v1);
    in_RSI[1] = nVar3;
  }
  return;
}

Assistant:

NK_INTERN void
nk_font_query_font_glyph(nk_handle handle, float height,
struct nk_user_font_glyph *glyph, nk_rune codepoint, nk_rune next_codepoint)
{
float scale;
const struct nk_font_glyph *g;
struct nk_font *font;

NK_ASSERT(glyph);
NK_UNUSED(next_codepoint);

font = (struct nk_font*)handle.ptr;
NK_ASSERT(font);
NK_ASSERT(font->glyphs);
if (!font || !glyph)
return;

scale = height/font->info.height;
g = nk_font_find_glyph(font, codepoint);
glyph->width = (g->x1 - g->x0) * scale;
glyph->height = (g->y1 - g->y0) * scale;
glyph->offset = nk_vec2(g->x0 * scale, g->y0 * scale);
glyph->xadvance = (g->xadvance * scale);
glyph->uv[0] = nk_vec2(g->u0, g->v0);
glyph->uv[1] = nk_vec2(g->u1, g->v1);
}